

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductMenu.h
# Opt level: O2

void __thiscall
ProductMenu::ProductMenu
          (ProductMenu *this,string *title,string *subs,int size,
          vector<Product_*,_std::allocator<Product_*>_> *pList)

{
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)title);
  Menu::Menu(&this->super_Menu,&sStack_48,subs,size);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_Menu)._vptr_Menu = (_func_int **)&PTR_menuSwitch_0010fd58;
  (this->productList).super__Vector_base<Product_*,_std::allocator<Product_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->productList).super__Vector_base<Product_*,_std::allocator<Product_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->productList).super__Vector_base<Product_*,_std::allocator<Product_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->proList = pList;
  std::vector<Product_*,_std::allocator<Product_*>_>::operator=(&this->productList,pList);
  return;
}

Assistant:

ProductMenu(string title, string* subs, int size, vector<Product*> *pList) : Menu(title, subs, size){
        proList = pList;
        productList = *proList;
    }